

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall
Refal2::CFunctionBuilder::AddVariable
          (CFunctionBuilder *this,TVariableTypeTag type,TVariableName name,CQualifier *qualifier)

{
  bool bVar1;
  int local_34;
  TVariableIndex index;
  CQualifier *qualifier_local;
  TVariableName name_local;
  TVariableTypeTag type_local;
  CFunctionBuilder *this_local;
  
  if (((this->super_CVariablesBuilder).field_0x1aac & 1) == 0) {
    local_34 = CVariablesBuilder::AddLeft(&this->super_CVariablesBuilder,name,type);
  }
  else {
    local_34 = CVariablesBuilder::AddRight(&this->super_CVariablesBuilder,name,type);
  }
  bVar1 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (!bVar1) {
    if (local_34 == -1) {
      __assert_fail("index != InvalidVariableIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Function.cpp"
                    ,0x10a,
                    "void Refal2::CFunctionBuilder::AddVariable(TVariableTypeTag, TVariableName, CQualifier *)"
                   );
    }
    if (qualifier != (CQualifier *)0x0) {
      CVariablesBuilder::AddQualifier(&this->super_CVariablesBuilder,local_34,qualifier);
    }
    CUnitList::AppendVariable(&this->acc,local_34);
  }
  return;
}

Assistant:

void CFunctionBuilder::AddVariable( TVariableTypeTag type, TVariableName name,
	CQualifier* qualifier )
{
	const TVariableIndex index = isProcessRightPart ?
		CVariablesBuilder::AddRight( name, type ) :
		CVariablesBuilder::AddLeft( name, type );
	if( !HasErrors() ) {
		assert( index != InvalidVariableIndex );
		if( qualifier != nullptr ) {
			CVariablesBuilder::AddQualifier( index, *qualifier );
		}
		acc.AppendVariable( index );
	}
}